

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_last_id_Test::NameCacheTests_test_last_id_Test
          (NameCacheTests_test_last_id_Test *this)

{
  NameCacheTests_test_last_id_Test *this_local;
  
  NameCacheTests::NameCacheTests(&this->super_NameCacheTests);
  (this->super_NameCacheTests).super_Test._vptr_Test =
       (_func_int **)&PTR__NameCacheTests_test_last_id_Test_003de5e8;
  return;
}

Assistant:

TEST_F(NameCacheTests, test_last_id)
{
    EXPECT_EQ(0, name_cache_.LastID("Test"));
    EXPECT_EQ(0, name_cache_.LastID("Test"));
    EXPECT_EQ(1, name_cache_.NextID("Test"));
    EXPECT_EQ(2, name_cache_.NextID("Test"));
    EXPECT_EQ(2, name_cache_.LastID("Test"));
    EXPECT_EQ(2, name_cache_.LastID("Test"));
    EXPECT_EQ(0, name_cache_.LastID("Test2"));
    EXPECT_EQ(0, name_cache_.LastID("Test2"));
}